

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractbutton.cpp
# Opt level: O1

void QAbstractButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QSize QVar2;
  QSize QVar3;
  QSize QVar4;
  byte bVar5;
  QSize QVar6;
  QSize *pQVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  long in_FS_OFFSET;
  undefined1 checked;
  QIcon moved;
  QSize local_50;
  QSize local_48;
  QSize *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar10 = 0;
    goto LAB_003c6102;
  case 1:
    iVar10 = 1;
LAB_003c6102:
    pQVar7 = (QSize *)0x0;
LAB_003c6104:
    QMetaObject::activate(_o,&staticMetaObject,iVar10,(void **)pQVar7);
    break;
  case 2:
    clicked((QAbstractButton *)_o,*_a[1]);
    break;
  case 3:
    pQStack_40 = &local_50;
    local_50 = (QSize)((ulong)local_50 & 0xffffffffffffff00);
    pQVar7 = &local_48;
    local_48.wd.m_i = 0;
    local_48.ht.m_i = 0;
    iVar10 = 2;
    goto LAB_003c6104;
  case 4:
    toggled((QAbstractButton *)_o,*_a[1]);
    break;
  case 5:
    setIconSize((QAbstractButton *)_o,(QSize *)_a[1]);
    break;
  case 6:
    animateClick((QAbstractButton *)_o);
    break;
  case 7:
    click((QAbstractButton *)_o);
    break;
  case 8:
    checked = (*(byte *)(*(long *)(_o + 8) + 0x28c) & 2) == 0;
    goto LAB_003c6134;
  case 9:
    checked = *_a[1];
LAB_003c6134:
    setChecked((QAbstractButton *)_o,(bool)checked);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_003c6052_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == pressed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_003c6052_caseD_3;
      }
      if (((code *)*plVar1 == released) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_003c6052_caseD_3;
      }
      if (((code *)*plVar1 == clicked) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_003c6052_caseD_3;
      }
      if (((code *)*plVar1 == toggled) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_003c6052_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003c6052_caseD_3;
        goto switchD_003c6052_caseD_1;
      }
    }
    goto switchD_003c6052_caseD_2;
  }
switchD_003c6052_caseD_1:
  if (10 < (uint)_id) goto LAB_003c6361;
  pQVar7 = (QSize *)*_a;
  switch(_id) {
  case 0:
    lVar8 = *(long *)(_o + 8);
    QVar6 = *(QSize *)(lVar8 + 600);
    QVar2 = *(QSize *)(lVar8 + 0x260);
    QVar3 = *(QSize *)(lVar8 + 0x268);
    if (QVar6 != (QSize)0x0) {
      LOCK();
      *(int *)QVar6 = *(int *)QVar6 + 1;
      UNLOCK();
    }
    QVar4 = *pQVar7;
    *pQVar7 = QVar6;
    pQVar7[1] = QVar2;
    pQVar7[2] = QVar3;
    if (QVar4 != (QSize)0x0) {
      LOCK();
      *(int *)QVar4 = *(int *)QVar4 + -1;
      UNLOCK();
      if (*(int *)QVar4 == 0) {
        QArrayData::deallocate((QArrayData *)QVar4,2,0x10);
      }
    }
    break;
  case 1:
    QIcon::QIcon((QIcon *)&local_50,(QIcon *)(*(long *)(_o + 8) + 0x270));
    QVar6 = local_50;
    local_50.wd.m_i = 0;
    local_50.ht.m_i = 0;
    local_48 = *pQVar7;
    *pQVar7 = QVar6;
    QIcon::~QIcon((QIcon *)&local_48);
    QIcon::~QIcon((QIcon *)&local_50);
    break;
  case 2:
    QVar6 = iconSize((QAbstractButton *)_o);
    *pQVar7 = QVar6;
    break;
  case 3:
    QKeySequence::QKeySequence
              ((QKeySequence *)&local_48,(QKeySequence *)(*(long *)(_o + 8) + 0x280));
    QVar6 = *pQVar7;
    *pQVar7 = local_48;
    local_48 = QVar6;
    QKeySequence::~QKeySequence((QKeySequence *)&local_48);
    break;
  case 4:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c);
    goto LAB_003c634b;
  case 5:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 1;
    goto LAB_003c634b;
  case 6:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 2;
    goto LAB_003c634b;
  case 7:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 3;
    goto LAB_003c634b;
  case 8:
    iVar10 = *(int *)(*(long *)(_o + 8) + 0x2a0);
    goto LAB_003c635d;
  case 9:
    iVar10 = *(int *)(*(long *)(_o + 8) + 0x2a4);
LAB_003c635d:
    (pQVar7->wd).m_i = iVar10;
    break;
  case 10:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 4;
LAB_003c634b:
    *(byte *)&(pQVar7->wd).m_i = bVar5 & 1;
  }
LAB_003c6361:
  if (_c != WriteProperty) goto switchD_003c6052_caseD_3;
switchD_003c6052_caseD_2:
  if (10 < (uint)_id) goto switchD_003c6052_caseD_3;
  pQVar7 = (QSize *)*_a;
  switch(_id) {
  case 0:
    setText((QAbstractButton *)_o,(QString *)pQVar7);
    break;
  case 1:
    setIcon((QAbstractButton *)_o,(QIcon *)pQVar7);
    break;
  case 2:
    setIconSize((QAbstractButton *)_o,pQVar7);
    break;
  case 3:
    setShortcut((QAbstractButton *)_o,(QKeySequence *)pQVar7);
    break;
  case 4:
    bVar5 = (byte)(pQVar7->wd).m_i;
    lVar8 = *(long *)(_o + 8);
    if (((*(byte *)(lVar8 + 0x28c) ^ bVar5) & 1) == 0) break;
    bVar9 = *(byte *)(lVar8 + 0x28c) & 0xfc;
    goto LAB_003c63eb;
  case 5:
    setChecked((QAbstractButton *)_o,SUB41((pQVar7->wd).m_i,0));
    break;
  case 6:
    setAutoRepeat((QAbstractButton *)_o,SUB41((pQVar7->wd).m_i,0));
    break;
  case 7:
    lVar8 = *(long *)(_o + 8);
    bVar5 = (char)(pQVar7->wd).m_i << 3;
    bVar9 = *(byte *)(lVar8 + 0x28c) & 0xf7;
LAB_003c63eb:
    *(byte *)(lVar8 + 0x28c) = bVar9 | bVar5;
    break;
  case 8:
    *(int *)(*(long *)(_o + 8) + 0x2a0) = (pQVar7->wd).m_i;
    break;
  case 9:
    *(int *)(*(long *)(_o + 8) + 0x2a4) = (pQVar7->wd).m_i;
    break;
  case 10:
    setDown((QAbstractButton *)_o,SUB41((pQVar7->wd).m_i,0));
  }
switchD_003c6052_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed(); break;
        case 1: _t->released(); break;
        case 2: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->clicked(); break;
        case 4: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 6: _t->animateClick(); break;
        case 7: _t->click(); break;
        case 8: _t->toggle(); break;
        case 9: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::released, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::clicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::toggled, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 3: *reinterpret_cast<QKeySequence*>(_v) = _t->shortcut(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->autoRepeat(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->autoExclusive(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->autoRepeatDelay(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->autoRepeatInterval(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isDown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setShortcut(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 4: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAutoRepeat(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAutoExclusive(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoRepeatDelay(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setAutoRepeatInterval(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setDown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}